

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::add_tests(APITests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  TestFunction local_58;
  
  TestSuit::reserve(&this->super_TestSuit,100);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_warnings_off","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:778:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:778:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  paVar2 = &local_58.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_warnings_on","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:779:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:779:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_cleanup_multiple_channels","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:780:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:780:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_cleanup_multiple_channels_in_vector","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:781:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:781:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_board","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:782:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:782:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_bcm","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:783:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:783:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_cvm","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:784:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:784:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_tegra_soc","")
  ;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:785:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:785:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_twice","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:786:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:786:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_setup_one_out_no_init","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:787:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:787:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_out_high","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:788:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:788:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_out_low","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:789:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:789:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_one_in","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:790:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:790:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_all0","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:791:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:791:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_setup_all1","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:792:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:792:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_setup_multiple_outputs0","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:793:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:793:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_setup_multiple_outputs1","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:794:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:794:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_setup_multiple_outputs2","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:795:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:795:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_cleanup_one","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:796:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:796:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_cleanup_all","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:797:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:797:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_input","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:798:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:798:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_output_one","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:799:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:799:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_multiple_outputs0","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:800:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:800:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_multiple_outputs1","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:801:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:801:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_out_in_init_high","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:802:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:802:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_out_in_init_low","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:803:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:803:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_gpio_function_unexported","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:804:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:804:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_gpio_function_in","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:805:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:805:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_gpio_function_out","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:806:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:806:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_wait_for_edge_rising","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:809:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:809:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_wait_for_edge_falling","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:810:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:810:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_event_detected_rising","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:811:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:811:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_event_detected_falling","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:812:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:812:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_event_detected_both","")
  ;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:813:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:813:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_add_callback_before_add_event_detect","");
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:814:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:814:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
  TestSuit::add(&this->super_TestSuit,&local_58);
  if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.func.super__Function_base._M_manager)
              ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((this->pin_data).all_pwms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pin_data).all_pwms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_pwm_multi_duty","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:819:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:819:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"test_pwm_change_frequency","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:820:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:820:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"test_pwm_change_duty_cycle","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:821:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:821:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_pwm_cleanup_none","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:822:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:822:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_pwm_cleanup_stop","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:823:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:823:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_pwm_cleanup_del","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:824:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:824:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test_pwm_create_all","");
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:825:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:825:13)>
               ::_M_manager;
    local_78._M_unused._M_object = this;
    TestFunction::TestFunction(&local_58,&local_98,(function<void_()> *)&local_78);
    TestSuit::add(&this->super_TestSuit,&local_58);
    if (local_58.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func.super__Function_base._M_manager)
                ((_Any_data *)&local_58.func,(_Any_data *)&local_58.func,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void add_tests()
    {
        reserve(100);
#define ADD_TEST(NAME) add({#NAME, [this]() { NAME(); }})

        ADD_TEST(test_warnings_off);
        ADD_TEST(test_warnings_on);
        ADD_TEST(test_cleanup_multiple_channels);
        ADD_TEST(test_cleanup_multiple_channels_in_vector);
        ADD_TEST(test_setup_one_board);
        ADD_TEST(test_setup_one_bcm);
        ADD_TEST(test_setup_one_cvm);
        ADD_TEST(test_setup_one_tegra_soc);
        ADD_TEST(test_setup_twice);
        ADD_TEST(test_setup_one_out_no_init);
        ADD_TEST(test_setup_one_out_high);
        ADD_TEST(test_setup_one_out_low);
        ADD_TEST(test_setup_one_in);
        ADD_TEST(test_setup_all0);
        ADD_TEST(test_setup_all1);
        ADD_TEST(test_setup_multiple_outputs0);
        ADD_TEST(test_setup_multiple_outputs1);
        ADD_TEST(test_setup_multiple_outputs2);
        ADD_TEST(test_cleanup_one);
        ADD_TEST(test_cleanup_all);
        ADD_TEST(test_input);
        ADD_TEST(test_output_one);
        ADD_TEST(test_multiple_outputs0);
        ADD_TEST(test_multiple_outputs1);
        ADD_TEST(test_out_in_init_high);
        ADD_TEST(test_out_in_init_low);
        ADD_TEST(test_gpio_function_unexported);
        ADD_TEST(test_gpio_function_in);
        ADD_TEST(test_gpio_function_out);

        // event
        ADD_TEST(test_wait_for_edge_rising);
        ADD_TEST(test_wait_for_edge_falling);
        ADD_TEST(test_event_detected_rising);
        ADD_TEST(test_event_detected_falling);
        ADD_TEST(test_event_detected_both);
        ADD_TEST(test_add_callback_before_add_event_detect);

        // pwm
        if (!pin_data.all_pwms.empty())
        {
            ADD_TEST(test_pwm_multi_duty);
            ADD_TEST(test_pwm_change_frequency);
            ADD_TEST(test_pwm_change_duty_cycle);
            ADD_TEST(test_pwm_cleanup_none);
            ADD_TEST(test_pwm_cleanup_stop);
            ADD_TEST(test_pwm_cleanup_del);
            ADD_TEST(test_pwm_create_all);
        }

#undef ADD_TEST
    }